

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastaTest_CompressedParseAndReset_Test::TestBody
          (BioparserFastaTest_CompressedParseAndReset_Test *this)

{
  bool bVar1;
  pointer pPVar2;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *this_00;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  local_c8;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *local_b0;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *local_a8;
  __normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
  local_a0;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *local_98;
  move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>_>
  local_90;
  __normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
  local_88;
  const_iterator local_80;
  undefined1 local_78 [8];
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  t;
  allocator local_31;
  string local_30;
  BioparserFastaTest_CompressedParseAndReset_Test *local_10;
  BioparserFastaTest_CompressedParseAndReset_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sample.fasta.gz",&local_31);
  BioparserFastaTest::Setup(&this->super_BioparserFastaTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar2 = std::
           unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ::operator->(&(this->super_BioparserFastaTest).p);
  (*pPVar2->_vptr_Parser[2])
            (&t.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pPVar2,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::operator=(&(this->super_BioparserFastaTest).s,
              (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
               *)&t.
                  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             *)&t.
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pPVar2 = std::
           unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ::operator->(&(this->super_BioparserFastaTest).p);
  Parser<biosoup::Sequence>::Reset(pPVar2);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::clear(&(this->super_BioparserFastaTest).s);
  pPVar2 = std::
           unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ::operator->(&(this->super_BioparserFastaTest).p);
  (*pPVar2->_vptr_Parser[2])(local_78,pPVar2,0x10000,1);
  while( true ) {
    bVar1 = std::
            vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
            ::empty((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                     *)local_78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = &(this->super_BioparserFastaTest).s;
    local_88._M_current =
         (unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *)
         std::
         vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
         ::end(this_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>const*,std::vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>>
    ::__normal_iterator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>*>
              ((__normal_iterator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>const*,std::vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>>
                *)&local_80,&local_88);
    local_98 = (unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *)
               std::
               vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
               ::begin((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                        *)local_78);
    local_90 = std::
               make_move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>*,std::vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>>>
                         ((__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
                           )local_98);
    local_a8 = (unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *)
               std::
               vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
               ::end((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                      *)local_78);
    local_a0._M_current =
         (unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *)
         std::
         make_move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>*,std::vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>>>
                   ((__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
                     )local_a8);
    local_b0 = (unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *)
               std::
               vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>
               ::
               insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>*,std::vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>>>,void>
                         ((vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>
                           *)this_00,local_80,local_90,
                          (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>_>
                           )local_a0._M_current);
    pPVar2 = std::
             unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
             ::operator->(&(this->super_BioparserFastaTest).p);
    (*pPVar2->_vptr_Parser[2])(&local_c8,pPVar2,0x10000,1);
    std::
    vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
    ::operator=((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 *)local_78,&local_c8);
    std::
    vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
    ::~vector(&local_c8);
  }
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             *)local_78);
  BioparserFastaTest::Check(&this->super_BioparserFastaTest,true);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, CompressedParseAndReset) {
  Setup("sample.fasta.gz");
  s = p->Parse(-1);
  p->Reset();
  s.clear();
  for (auto t = p->Parse(65536); !t.empty(); t = p->Parse(65536)) {
    s.insert(
        s.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}